

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O3

void __thiscall
Vault::AppRoleStrategy::AppRoleStrategy(AppRoleStrategy *this,RoleId *roleId,SecretId *secretId)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_type *local_48;
  size_type local_40;
  size_type local_38;
  undefined8 uStack_30;
  
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__AppRoleStrategy_001c2320;
  paVar1 = &(this->roleId_).value_.field_2;
  (this->roleId_).value_._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (roleId->value_)._M_dataplus._M_p;
  paVar2 = &(roleId->value_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(roleId->value_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->roleId_).value_.field_2 + 8) = uVar4;
  }
  else {
    (this->roleId_).value_._M_dataplus._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->roleId_).value_._M_string_length = (roleId->value_)._M_string_length;
  (roleId->value_)._M_dataplus._M_p = (pointer)paVar2;
  (roleId->value_)._M_string_length = 0;
  (roleId->value_).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->secretId_).value_.field_2;
  (this->secretId_).value_._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (secretId->value_)._M_dataplus._M_p;
  paVar2 = &(secretId->value_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(secretId->value_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->secretId_).value_.field_2 + 8) = uVar4;
  }
  else {
    (this->secretId_).value_._M_dataplus._M_p = pcVar3;
    (this->secretId_).value_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->secretId_).value_._M_string_length = (secretId->value_)._M_string_length;
  (secretId->value_)._M_dataplus._M_p = (pointer)paVar2;
  (secretId->value_)._M_string_length = 0;
  (secretId->value_).field_2._M_local_buf[0] = '\0';
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"approle","");
  paVar1 = &(this->mount_).value_.field_2;
  (this->mount_).value_._M_dataplus._M_p = (pointer)paVar1;
  if (local_48 == &local_38) {
    paVar1->_M_allocated_capacity = local_38;
    *(undefined8 *)((long)&(this->mount_).value_.field_2 + 8) = uStack_30;
  }
  else {
    (this->mount_).value_._M_dataplus._M_p = (pointer)local_48;
    (this->mount_).value_.field_2._M_allocated_capacity = local_38;
  }
  (this->mount_).value_._M_string_length = local_40;
  return;
}

Assistant:

explicit AppRoleStrategy(RoleId roleId, SecretId secretId)
      : roleId_(std::move(roleId)), secretId_(std::move(secretId)),
        mount_(Path{"approle"}) {}